

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldTypes.h
# Opt level: O3

DateTime * FIX::DateTime::fromTm(DateTime *__return_storage_ptr__,tm *tm,int fraction,int precision)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  
  iVar9 = convertToNanos(fraction,precision);
  iVar2 = tm->tm_mon;
  iVar7 = (0xd - iVar2) / 0xc;
  iVar10 = tm->tm_year - iVar7;
  iVar1 = iVar10 + 0x1a2c;
  iVar10 = iVar10 + 0x1a2f;
  if (-1 < iVar1) {
    iVar10 = iVar1;
  }
  iVar8 = (int)((ulong)((long)iVar1 * -0x51eb851f) >> 0x20);
  iVar3 = tm->tm_mday;
  iVar4 = tm->tm_hour;
  iVar5 = tm->tm_min;
  iVar6 = tm->tm_sec;
  __return_storage_ptr__->_vptr_DateTime = (_func_int **)&PTR__DateTime_00324898;
  __return_storage_ptr__->m_date =
       iVar1 * 0x16d + iVar3 + (iVar10 >> 2) + iVar1 / 400 + ((iVar8 >> 5) - (iVar8 >> 0x1f)) +
       ((iVar2 + iVar7 * 0xc) * 0x99 + -0x130) / 5 + -0x7d2d;
  __return_storage_ptr__->m_time =
       (long)iVar9 + ((long)iVar5 * 0x3c + (long)iVar4 * 0xe10 + (long)iVar6) * 1000000000;
  return __return_storage_ptr__;
}

Assistant:

static DateTime fromTm( const tm& tm, int fraction, int precision )
  {
    int nanos = convertToNanos(fraction, precision);
    return DateTime ( julianDate(tm.tm_year + 1900, tm.tm_mon + 1,
                                 tm.tm_mday),
                     makeHMS(tm.tm_hour, tm.tm_min, tm.tm_sec, nanos) );
  }